

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O2

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmRuntimeDependencyArchive *pcVar1;
  bool bVar2;
  int iVar3;
  cmMakefile *this_00;
  string *psVar4;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar5;
  uv_loop_t *loop;
  istream *piVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmUVProcessChain process;
  cmList ldConfigCommand;
  string ldConfigPath;
  string line;
  string local_458;
  cmUVProcessChainBuilder builder;
  RegularExpressionMatch match;
  cmUVPipeIStream output;
  
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&match,"CMAKE_LDCONFIG_COMMAND",(allocator<char> *)&output);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&match);
  std::__cxx11::string::string((string *)&ldConfigPath,(string *)psVar4);
  std::__cxx11::string::~string((string *)&match);
  if (ldConfigPath._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&match,"/sbin",(allocator<char> *)&line);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(match.startp + 4),"/usr/sbin",(allocator<char> *)&local_458);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(match.startp + 8),"/usr/local/sbin",(allocator<char> *)&ldConfigCommand);
    __l._M_len = 3;
    __l._M_array = (iterator)&match;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&builder,__l,(allocator_type *)&process);
    cmsys::SystemTools::FindProgram
              ((string *)&output,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&builder,false);
    std::__cxx11::string::operator=((string *)&ldConfigPath,(string *)&output);
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&builder);
    lVar7 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)match.startp + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    if (ldConfigPath._M_string_length == 0) {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&match,"Could not find ldconfig",(allocator<char> *)&output);
      cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
      std::__cxx11::string::~string((string *)&match);
      bVar2 = false;
      goto LAB_0058e118;
    }
  }
  std::__cxx11::string::string((string *)&match,(string *)&ldConfigPath);
  init._M_len = 1;
  init._M_array = (iterator)&match;
  cmList::cmList(&ldConfigCommand,init);
  std::__cxx11::string::~string((string *)&match);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ldConfigCommand,
             (char (*) [3])0x76ffac);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&ldConfigCommand.Values);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
  bVar2 = cmUVProcessChain::Valid(&process);
  if (bVar2) {
    pSVar5 = cmUVProcessChain::GetStatus(&process,0);
    if (pSVar5->SpawnResult != 0) goto LAB_0058e0b9;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    if (GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
        regex == '\0') {
      iVar3 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::regex);
      if (iVar3 != 0) {
        cmsys::RegularExpression::RegularExpression(&GetLDConfigPaths::regex,"^([^\t:]*):");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                     &__dso_handle);
        __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
    }
    loop = cmUVProcessChain::GetLoop(&process);
    iVar3 = cmUVProcessChain::OutputStream(&process);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream(&output,loop,iVar3);
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&output,(string *)&line);
      if (((&piVar6->field_0x20)[(long)piVar6->_vptr_basic_istream[-3]] & 5) != 0) break;
      memset(&match,0,0x208);
      bVar2 = cmsys::RegularExpression::find(&GetLDConfigPaths::regex,line._M_dataplus._M_p,&match);
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_458,&match,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths,
                   &local_458);
        std::__cxx11::string::~string((string *)&local_458);
      }
    }
    bVar2 = cmUVProcessChain::Wait(&process,0);
    if (bVar2) {
      pSVar5 = cmUVProcessChain::GetStatus(&process,0);
      if (pSVar5->ExitStatus != 0) {
        pcVar1 = (this->super_cmLDConfigTool).Archive;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&match,"Failed to run ldconfig",(allocator<char> *)&local_458);
        cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
        goto LAB_0058e2d2;
      }
      bVar2 = true;
    }
    else {
      pcVar1 = (this->super_cmLDConfigTool).Archive;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&match,"Failed to wait on ldconfig process",(allocator<char> *)&local_458
                );
      cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
LAB_0058e2d2:
      std::__cxx11::string::~string((string *)&match);
      bVar2 = false;
    }
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream(&output);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
LAB_0058e0b9:
    pcVar1 = (this->super_cmLDConfigTool).Archive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&match,"Failed to start ldconfig process",(allocator<char> *)&output);
    cmRuntimeDependencyArchive::SetError(pcVar1,(string *)&match);
    std::__cxx11::string::~string((string *)&match);
    bVar2 = false;
  }
  cmUVProcessChain::~cmUVProcessChain(&process);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ldConfigCommand.Values);
LAB_0058e118:
  std::__cxx11::string::~string((string *)&ldConfigPath);
  return bVar2;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  cmList ldConfigCommand{ ldConfigPath };
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}